

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_ThreadSafety::Run(void)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  string *s;
  long lVar8;
  void *vthread_return;
  string filename;
  pthread_t thread_ids [10];
  
  std::__cxx11::string::string
            ((string *)thread_ids,"(testing thread-safety)",(allocator *)&vthread_return);
  s = (string *)thread_ids;
  ctemplate::StringToTemplateFile(&filename,s);
  std::__cxx11::string::~string((string *)thread_ids);
  lVar8 = 0;
  do {
    lVar5 = lVar8;
    if (lVar5 + 8 == 0x58) {
      lVar8 = 0;
      iVar3 = 0;
      plVar6 = (long *)0x0;
      goto LAB_0011531b;
    }
    s = (string *)0x0;
    iVar3 = pthread_create((pthread_t *)((long)thread_ids + lVar5),(pthread_attr_t *)0x0,RunThread,
                           filename._M_dataplus._M_p);
    lVar8 = lVar5 + 8;
  } while (iVar3 == 0);
  printf("ASSERT FAILED, line %d: %s\n",0x585,
         "pthread_create(thread_ids+i, NULL, RunThread, (void*)filename.c_str()) == 0");
  iVar3 = pthread_create((pthread_t *)((long)thread_ids + lVar5),(pthread_attr_t *)0x0,RunThread,
                         filename._M_dataplus._M_p);
  if (iVar3 != 0) {
    __assert_fail("pthread_create(thread_ids+i, __null, RunThread, (void*)filename.c_str()) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x585,"static void Test_Template_ThreadSafety::Run()");
  }
LAB_0011545d:
  exit(1);
LAB_0011531b:
  iVar4 = (int)s;
  if (lVar8 == 10) goto LAB_00115370;
  s = (string *)&vthread_return;
  iVar4 = pthread_join(thread_ids[lVar8],&vthread_return);
  if (iVar4 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x58d,"pthread_join(thread_ids[i], &vthread_return) == 0")
    ;
    iVar3 = pthread_join(thread_ids[lVar8],&vthread_return);
    if (iVar3 != 0) {
      __assert_fail("pthread_join(thread_ids[i], &vthread_return) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x58d,"static void Test_Template_ThreadSafety::Run()");
    }
    goto LAB_0011545d;
  }
  bVar1 = *(byte *)((long)vthread_return + 8);
  plVar7 = (long *)vthread_return;
  if (plVar6 != (long *)0x0) {
    if (*vthread_return != *plVar6) {
      printf("ASSERT FAILED, line %d: %s\n",0x597,
             "thread_return->file_template == first_thread_return->file_template");
      if (*vthread_return != *plVar6) {
        __assert_fail("thread_return->file_template == first_thread_return->file_template",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x597,"static void Test_Template_ThreadSafety::Run()");
      }
      goto LAB_0011545d;
    }
    if (*(long *)((long)vthread_return + 0x10) != plVar6[2]) {
      printf("ASSERT FAILED, line %d: %s\n",0x599,
             "thread_return->string_template == first_thread_return->string_template");
      if (*(long *)((long)vthread_return + 0x10) != plVar6[2]) {
        __assert_fail("thread_return->string_template == first_thread_return->string_template",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x599,"static void Test_Template_ThreadSafety::Run()");
      }
      goto LAB_0011545d;
    }
    operator_delete(vthread_return);
    plVar7 = plVar6;
  }
  iVar3 = iVar3 + (uint)bVar1;
  lVar8 = lVar8 + 1;
  plVar6 = plVar7;
  goto LAB_0011531b;
LAB_00115370:
  operator_delete(plVar6);
  bVar2 = anon_unknown.dwarf_daf5::IntEqVerbose(iVar3,iVar4);
  if (bVar2) {
    ctemplate::Template::ClearCache();
    std::__cxx11::string::~string((string *)&filename);
    return;
  }
  iVar4 = 0x59e;
  printf("ASSERT FAILED, line %d: %s\n",0x59e,
         "IntEqVerbose(1, num_times_string_to_template_cache_returned_true)");
  bVar2 = anon_unknown.dwarf_daf5::IntEqVerbose(iVar3,iVar4);
  if (!bVar2) {
    __assert_fail("IntEqVerbose(1, num_times_string_to_template_cache_returned_true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x59e,"static void Test_Template_ThreadSafety::Run()");
  }
  goto LAB_0011545d;
}

Assistant:

TEST(Template, ThreadSafety) {
  string filename = StringToTemplateFile("(testing thread-safety)");

  // GetTemplate() is the most thread-contended routine.  We get a
  // template in many threads, and assert we get the same template
  // from each.
  pthread_t thread_ids[kNumThreads];
  for (int i = 0; i < kNumThreads; ++i) {
    ASSERT(pthread_create(thread_ids+i, NULL, RunThread,
                          (void*)filename.c_str())
           == 0);
  }

  // Wait for all the threads to terminate (should be very quick!)
  ThreadReturn* first_thread_return = NULL;
  int num_times_string_to_template_cache_returned_true = 0;
  for (int i = 0; i < kNumThreads; ++i) {
    void* vthread_return;
    ASSERT(pthread_join(thread_ids[i], &vthread_return) == 0);
    ThreadReturn* thread_return =
        reinterpret_cast<ThreadReturn*>(vthread_return);
    if (thread_return->string_to_template_cache_return) {
      ++num_times_string_to_template_cache_returned_true;
    }
    if (first_thread_return == NULL) {   // we're the first thread
      first_thread_return = thread_return;
    } else {
      ASSERT(thread_return->file_template ==
             first_thread_return->file_template);
      ASSERT(thread_return->string_template ==
             first_thread_return->string_template);
      delete thread_return;
    }
  }
  delete first_thread_return;
  ASSERT_INTEQ(1, num_times_string_to_template_cache_returned_true);
  Template::ClearCache();
}